

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O1

void LinkedList::delete_all<std::__cxx11::string>
               (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **head)

{
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar1;
  pointer pcVar2;
  
  pNVar1 = *head;
  if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    if (pNVar1->_next !=
        (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        0x0) {
      delete_all<std::__cxx11::string>(&pNVar1->_next);
    }
    pNVar1 = *head;
    if (pNVar1 != (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) {
      pcVar2 = (pNVar1->_item)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(pNVar1->_item).field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(pNVar1);
    }
    *head = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0;
  }
  return;
}

Assistant:

void delete_all(Node<T>*& head) {
        if (head == NULL)
            return;
        if (head->_next != NULL)
            delete_all(head->_next);
        delete head;
        head = NULL;
    }